

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_parse(REF_DBL *metric,REF_GRID ref_grid,int narg,char **args)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a0;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_148;
  double local_138;
  double local_130;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL ceil;
  REF_DBL h;
  REF_DBL r;
  REF_DBL geom [8];
  REF_DBL decay_distance;
  REF_DBL h0;
  REF_DBL diag_system [12];
  int local_3c;
  int local_38;
  REF_INT pos;
  REF_INT node;
  REF_INT i;
  char **args_local;
  int narg_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  local_3c = 0;
  do {
    while( true ) {
      if (narg <= local_3c) {
        return 0;
      }
      iVar1 = strncmp(args[local_3c],"--uniform",9);
      if (iVar1 == 0) break;
LAB_0026c01e:
      local_3c = local_3c + 1;
    }
    iVar1 = local_3c + 1;
    if ((iVar1 < narg) && (iVar2 = strncmp(args[iVar1],"box",3), iVar2 == 0)) {
      iVar1 = local_3c + 2;
      if (narg <= local_3c + 10) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xd16,"ref_metric_parse",
               "not enough arguments for\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
              );
        return 1;
      }
      iVar2 = strncmp(args[iVar1],"ceil",4);
      if ((iVar2 != 0) && (iVar2 = strncmp(args[iVar1],"floor",5), iVar2 != 0)) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xd1b,"ref_metric_parse",
               "ceil or floor is missing\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
              );
        return 1;
      }
      iVar1 = strncmp(args[iVar1],"ceil",4);
      local_130 = atof(args[local_3c + 3]);
      geom[7] = atof(args[local_3c + 4]);
      local_3c = local_3c + 5;
      if (local_130 <= 0.0) {
        local_130 = -local_130;
      }
      for (pos = 0; pos < 6; pos = pos + 1) {
        dVar4 = atof(args[local_3c]);
        geom[(long)pos + -1] = dVar4;
        local_3c = local_3c + 1;
      }
      if (iVar1 != 0) {
        if (ref_grid->mpi->id == 0) {
          printf("--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n",local_130,geom[7],r,
                 geom[0],geom[1],geom[2],geom[3],geom[4]);
        }
      }
      else if (ref_grid->mpi->id == 0) {
        printf("--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n",local_130,geom[7],r,geom[0]
               ,geom[1],geom[2],geom[3],geom[4]);
      }
      for (local_38 = 0; local_38 < ref_grid->node->max; local_38 = local_38 + 1) {
        if (((-1 < local_38) && (local_38 < ref_grid->node->max)) &&
           (-1 < ref_grid->node->global[local_38])) {
          uVar3 = ref_metric_cart_box_dist(&r,ref_grid->node->real + local_38 * 0xf,&h);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd36,"ref_metric_parse",(ulong)uVar3,"box dist");
            return uVar3;
          }
          _ref_private_macro_code_rss = local_130;
          if (geom[7] * 1e+20 <= 0.0) {
            local_138 = -(geom[7] * 1e+20);
          }
          else {
            local_138 = geom[7] * 1e+20;
          }
          if (-h <= 0.0) {
            local_148 = h;
          }
          else {
            local_148 = -h;
          }
          if (local_148 < local_138) {
            _ref_private_macro_code_rss = pow(2.0,-h / geom[7]);
            _ref_private_macro_code_rss = local_130 * _ref_private_macro_code_rss;
          }
          uVar3 = ref_matrix_diag_m(metric + local_38 * 6,&h0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd3b,"ref_metric_parse",(ulong)uVar3,"decomp");
            return uVar3;
          }
          if (iVar1 != 0) {
            if (h0 <= 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss)) {
              local_170 = h0;
            }
            else {
              local_170 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            h0 = local_170;
            if (diag_system[0] <= 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss))
            {
              local_178 = diag_system[0];
            }
            else {
              local_178 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[0] = local_178;
            if (diag_system[1] <= 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss))
            {
              local_180 = diag_system[1];
            }
            else {
              local_180 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[1] = local_180;
          }
          else {
            if (1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss) <= h0) {
              local_158 = h0;
            }
            else {
              local_158 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            h0 = local_158;
            if (1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss) <= diag_system[0])
            {
              local_160 = diag_system[0];
            }
            else {
              local_160 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[0] = local_160;
            if (1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss) <= diag_system[1])
            {
              local_168 = diag_system[1];
            }
            else {
              local_168 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[1] = local_168;
          }
          uVar3 = ref_matrix_form_m(&h0,metric + local_38 * 6);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd4b,"ref_metric_parse",(ulong)uVar3,"reform");
            return uVar3;
          }
          if (ref_grid->twod != 0) {
            metric[local_38 * 6 + 2] = 0.0;
            metric[local_38 * 6 + 4] = 0.0;
            metric[local_38 * 6 + 5] = 1.0;
          }
        }
      }
    }
    else {
      if ((narg <= iVar1) || (iVar1 = strncmp(args[iVar1],"cyl",3), iVar1 != 0)) goto LAB_0026c01e;
      iVar1 = local_3c + 2;
      if (narg <= local_3c + 0xc) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xd59,"ref_metric_parse",
               "not enough arguments for\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
              );
        return 1;
      }
      iVar2 = strncmp(args[iVar1],"ceil",4);
      if ((iVar2 != 0) && (iVar2 = strncmp(args[iVar1],"floor",5), iVar2 != 0)) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xd5e,"ref_metric_parse",
               "ceil or floor is missing\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
              );
        return 1;
      }
      iVar1 = strncmp(args[iVar1],"ceil",4);
      local_188 = atof(args[local_3c + 3]);
      geom[7] = atof(args[local_3c + 4]);
      local_3c = local_3c + 5;
      if (local_188 <= 0.0) {
        local_188 = -local_188;
      }
      for (pos = 0; pos < 8; pos = pos + 1) {
        dVar4 = atof(args[local_3c]);
        geom[(long)pos + -1] = dVar4;
        local_3c = local_3c + 1;
      }
      for (local_38 = 0; local_38 < ref_grid->node->max; local_38 = local_38 + 1) {
        if (((-1 < local_38) && (local_38 < ref_grid->node->max)) &&
           (-1 < ref_grid->node->global[local_38])) {
          uVar3 = ref_metric_truncated_cone_dist(&r,ref_grid->node->real + local_38 * 0xf,&h);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd6d,"ref_metric_parse",(ulong)uVar3,"trunc cone dist");
            return uVar3;
          }
          _ref_private_macro_code_rss = local_188;
          if (geom[7] * 1e+20 <= 0.0) {
            local_190 = -(geom[7] * 1e+20);
          }
          else {
            local_190 = geom[7] * 1e+20;
          }
          if (-h <= 0.0) {
            local_1a0 = h;
          }
          else {
            local_1a0 = -h;
          }
          if (local_1a0 < local_190) {
            _ref_private_macro_code_rss = pow(2.0,-h / geom[7]);
            _ref_private_macro_code_rss = local_188 * _ref_private_macro_code_rss;
          }
          uVar3 = ref_matrix_diag_m(metric + local_38 * 6,&h0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd72,"ref_metric_parse",(ulong)uVar3,"decomp");
            return uVar3;
          }
          if (iVar1 == 0) {
            if (1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss) <= h0) {
              local_1b0 = h0;
            }
            else {
              local_1b0 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            h0 = local_1b0;
            if (1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss) <= diag_system[0])
            {
              local_1b8 = diag_system[0];
            }
            else {
              local_1b8 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[0] = local_1b8;
            if (1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss) <= diag_system[1])
            {
              local_1c0 = diag_system[1];
            }
            else {
              local_1c0 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[1] = local_1c0;
          }
          else {
            if (h0 <= 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss)) {
              local_1c8 = h0;
            }
            else {
              local_1c8 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            h0 = local_1c8;
            if (diag_system[0] <= 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss))
            {
              local_1d0 = diag_system[0];
            }
            else {
              local_1d0 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[0] = local_1d0;
            if (diag_system[1] <= 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss))
            {
              local_1d8 = diag_system[1];
            }
            else {
              local_1d8 = 1.0 / (_ref_private_macro_code_rss * _ref_private_macro_code_rss);
            }
            diag_system[1] = local_1d8;
          }
          uVar3 = ref_matrix_form_m(&h0,metric + local_38 * 6);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd82,"ref_metric_parse",(ulong)uVar3,"reform");
            return uVar3;
          }
          if (ref_grid->twod != 0) {
            metric[local_38 * 6 + 2] = 0.0;
            metric[local_38 * 6 + 4] = 0.0;
            metric[local_38 * 6 + 5] = 1.0;
          }
        }
      }
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_parse(REF_DBL *metric, REF_GRID ref_grid,
                                    int narg, char *args[]) {
  REF_INT i, node, pos;
  REF_DBL diag_system[12];
  REF_DBL h0, decay_distance;
  REF_DBL geom[8];
  REF_DBL r, h;
  REF_BOOL ceil;

  pos = 0;
  while (pos < narg) {
    if (strncmp(args[pos], "--uniform", 9) != 0) {
      pos++;
    } else {
      pos++;
      if (pos < narg && strncmp(args[pos], "box", 3) == 0) {
        pos++;
        RAS(pos + 8 < narg,
            "not enough arguments for\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 6; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }

        if (ceil) {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        } else {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_cart_box_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "box dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
      if (pos < narg && strncmp(args[pos], "cyl", 3) == 0) {
        pos++;
        RAS(pos + 10 < narg,
            "not enough arguments for\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 8; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_truncated_cone_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "trunc cone dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
    }
  }
  return REF_SUCCESS;
}